

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

void __thiscall
TTD::TextFormatWriter::WriteNakedDouble(TextFormatWriter *this,double val,Separator separator)

{
  bool bVar1;
  size_t bufflen;
  undefined7 in_register_00000031;
  char16_t *buff;
  undefined1 auVar2 [16];
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])(this,CONCAT71(in_register_00000031,separator));
  bVar1 = Js::NumberUtilities::IsNan(val);
  if (bVar1) {
    buff = L"#nan";
    bufflen = 8;
  }
  else {
    bVar1 = Js::NumberUtilities::IsSpecial(val,0x7ff0000000000000);
    if (bVar1) {
      buff = L"#+inf";
    }
    else {
      bVar1 = Js::NumberUtilities::IsSpecial(val,0xfff0000000000000);
      if (!bVar1) {
        if ((val != 1.79769313486232e+308) || (NAN(val))) {
          if ((val != 4.94065645841247e-324) || (NAN(val))) {
            if ((val != 2.220446049250313e-16) || (NAN(val))) {
              if (val == 2147483647.0) {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = val;
                auVar2 = roundsd(ZEXT816(0),auVar2,9);
                if ((auVar2._0_8_ == val) && (!NAN(auVar2._0_8_) && !NAN(val))) {
                  FileWriter::WriteFormattedCharData<6ul,long>
                            (&this->super_FileWriter,(char16 (*) [6])0x10f8b5c,(long)val);
                  return;
                }
              }
              FileWriter::WriteFormattedCharData<6ul,double>
                        (&this->super_FileWriter,(char16 (*) [6])L"%.32f",val);
              return;
            }
            buff = L"#ep";
          }
          else {
            buff = L"#lb";
          }
        }
        else {
          buff = L"#ub";
        }
        bufflen = 6;
        goto LAB_00916dee;
      }
      buff = L"#-inf";
    }
    bufflen = 10;
  }
LAB_00916dee:
  FileWriter::WriteRawByteBuff(&this->super_FileWriter,(byte *)buff,bufflen);
  return;
}

Assistant:

void TextFormatWriter::WriteNakedDouble(double val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(Js::JavascriptNumber::IsNan(val))
        {
            this->WriteRawCharBuff(_u("#nan"), 4);
        }
        else if(Js::JavascriptNumber::IsPosInf(val))
        {
            this->WriteRawCharBuff(_u("#+inf"), 5);
        }
        else if(Js::JavascriptNumber::IsNegInf(val))
        {
            this->WriteRawCharBuff(_u("#-inf"), 5);
        }
        else if(Js::JavascriptNumber::MAX_VALUE == val)
        {
            this->WriteRawCharBuff(_u("#ub"), 3);
        }
        else if(Js::JavascriptNumber::MIN_VALUE == val)
        {
            this->WriteRawCharBuff(_u("#lb"), 3);
        }
        else if(Js::Math::EPSILON == val)
        {
            this->WriteRawCharBuff(_u("#ep"), 3);
        }
        else
        {
            if(INT32_MAX <= val && val <= INT32_MAX && floor(val) == val)
            {
                this->WriteFormattedCharData(_u("%I64i"), (int64)val);
            }
            else
            {
                //
                //TODO: this is nice for visual debugging but we inherently lose precision
                //      will want to change this to a dump of the bit representation of the number
                //

                this->WriteFormattedCharData(_u("%.32f"), val);
            }
        }
    }